

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

void __thiscall QList<QMimeMagicRule>::clear(QList<QMimeMagicRule> *this)

{
  Data *pDVar1;
  QMimeMagicRule *pQVar2;
  qsizetype capacity;
  __off_t in_RDX;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayDataPointer<QMimeMagicRule> local_38;
  QArrayData *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->d).size != 0) {
    pDVar1 = (this->d).d;
    if ((pDVar1 != (Data *)0x0) &&
       ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QtPrivate::QGenericArrayOps<QMimeMagicRule>::truncate
                  ((QGenericArrayOps<QMimeMagicRule> *)this,(char *)0x0,in_RDX);
        return;
      }
      goto LAB_004c5bef;
    }
    local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.ptr = (QMimeMagicRule *)&DAT_aaaaaaaaaaaaaaaa;
    if (pDVar1 == (Data *)0x0) {
      capacity = 0;
    }
    else {
      capacity = (pDVar1->super_QArrayData).alloc;
    }
    local_20 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = (QMimeMagicRule *)QArrayData::allocate(&local_20,0x88,0x10,capacity,KeepSize);
    local_38.d = (this->d).d;
    local_38.ptr = (this->d).ptr;
    (this->d).d = (Data *)local_20;
    (this->d).ptr = pQVar2;
    local_38.size = (this->d).size;
    (this->d).size = 0;
    QArrayDataPointer<QMimeMagicRule>::~QArrayDataPointer(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_004c5bef:
  __stack_chk_fail();
}

Assistant:

void clear() {
        if (!size())
            return;
        if (d->needsDetach()) {
            // must allocate memory
            DataPointer detached(d.allocatedCapacity());
            d.swap(detached);
        } else {
            d->truncate(0);
        }
    }